

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void firstSatGroup(int g,int sign)

{
  int iVar1;
  Clause *pCVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = groupSize;
  iVar1 = 1;
  while (iVar5 = iVar1, piVar3 = permute, pCVar2 = clauseArray, iVar5 < iVar6) {
    for (iVar4 = iVar5 + 1; iVar1 = iVar5 + 1, iVar4 <= iVar6; iVar4 = iVar4 + 1) {
      lVar7 = (long)clauseCount;
      clauseCount = clauseCount + 1;
      iVar1 = piVar3[iVar6 * g + iVar5];
      iVar6 = piVar3[iVar6 * g + iVar4];
      pCVar2[lVar7].numOfVariables = 2;
      pCVar2[lVar7].variables[0] = iVar1 * sign;
      pCVar2[lVar7].variables[1] = iVar6 * sign;
      iVar6 = groupSize;
    }
  }
  return;
}

Assistant:

void firstSatGroup (int g, int sign)
{
    int i,j;

    for (i=1;i<groupSize;i++)
        for (j=i+1;j<=groupSize;j++)
            set2Clause (&(clauseArray[clauseCount++]), sign*permute[g*groupSize+i], sign*permute[g*groupSize+j]);

}